

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::shaderexecutor::UnpackUnorm4x8Case::createInstance(UnpackUnorm4x8Case *this,Context *ctx)

{
  ShaderType shaderType;
  TestInstance *this_00;
  char *name;
  Context *ctx_local;
  UnpackUnorm4x8Case *this_local;
  
  this_00 = (TestInstance *)operator_new(0xa8);
  shaderType = (this->super_ShaderPackingFunctionCase).m_shaderType;
  name = tcu::TestNode::getName((TestNode *)this);
  UnpackUnorm4x8CaseInstance::UnpackUnorm4x8CaseInstance
            ((UnpackUnorm4x8CaseInstance *)this_00,ctx,shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,name);
  return this_00;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new UnpackUnorm4x8CaseInstance(ctx, m_shaderType, m_spec, getName());
	}